

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void idct16_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i alVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  byte bVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar30 = (long)bit * 0x100;
  iVar26 = -*(int *)((long)vert_filter_length_chroma + lVar30 + 0x200);
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1a0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x220);
  iVar34 = -iVar27;
  iVar24 = -*(int *)((long)vert_filter_length_chroma + lVar30 + 0x1f0);
  iVar25 = -*(int *)((long)vert_filter_length_chroma + lVar30 + 0x230);
  iVar32 = 1 << ((char)bit - 1U & 0x1f);
  iVar33 = -iVar2;
  iVar31 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar29 = 0x8000;
  if (0xf < iVar31) {
    iVar29 = 1 << ((char)iVar31 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x250);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x1d0);
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  auVar53._16_4_ = uVar1;
  auVar53._20_4_ = uVar1;
  auVar53._24_4_ = uVar1;
  auVar53._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x210);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar48._16_4_ = uVar1;
  auVar48._20_4_ = uVar1;
  auVar48._24_4_ = uVar1;
  auVar48._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x1b0);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 400);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar50._16_4_ = uVar1;
  auVar50._20_4_ = uVar1;
  auVar50._24_4_ = uVar1;
  auVar50._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x170);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  auVar55._16_4_ = uVar1;
  auVar55._20_4_ = uVar1;
  auVar55._24_4_ = uVar1;
  auVar55._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x240);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x1c0);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar43._4_4_ = iVar26;
  auVar43._0_4_ = iVar26;
  auVar43._8_4_ = iVar26;
  auVar43._12_4_ = iVar26;
  auVar43._16_4_ = iVar26;
  auVar43._20_4_ = iVar26;
  auVar43._24_4_ = iVar26;
  auVar43._28_4_ = iVar26;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x180);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  auVar39._4_4_ = iVar24;
  auVar39._0_4_ = iVar24;
  auVar39._8_4_ = iVar24;
  auVar39._12_4_ = iVar24;
  auVar39._16_4_ = iVar24;
  auVar39._20_4_ = iVar24;
  auVar39._24_4_ = iVar24;
  auVar39._28_4_ = iVar24;
  auVar52._4_4_ = iVar25;
  auVar52._0_4_ = iVar25;
  auVar52._8_4_ = iVar25;
  auVar52._12_4_ = iVar25;
  auVar52._16_4_ = iVar25;
  auVar52._20_4_ = iVar25;
  auVar52._24_4_ = iVar25;
  auVar52._28_4_ = iVar25;
  auVar38._4_4_ = iVar32;
  auVar38._0_4_ = iVar32;
  auVar38._8_4_ = iVar32;
  auVar38._12_4_ = iVar32;
  auVar38._16_4_ = iVar32;
  auVar38._20_4_ = iVar32;
  auVar38._24_4_ = iVar32;
  auVar38._28_4_ = iVar32;
  auVar55 = vpmulld_avx2((undefined1  [32])in[1],auVar55);
  auVar51 = vpmulld_avx2((undefined1  [32])in[1],auVar51);
  auVar39 = vpmulld_avx2((undefined1  [32])in[7],auVar39);
  auVar53 = vpmulld_avx2((undefined1  [32])in[7],auVar53);
  auVar55 = vpaddd_avx2(auVar55,auVar38);
  auVar36 = vpsrad_avx2(auVar55,ZEXT416((uint)bit));
  auVar55 = vpaddd_avx2(auVar51,auVar38);
  auVar19 = vpsrad_avx2(auVar55,ZEXT416((uint)bit));
  auVar51 = vpmulld_avx2((undefined1  [32])in[5],auVar35);
  auVar35 = vpmulld_avx2((undefined1  [32])in[5],auVar48);
  auVar55 = vpaddd_avx2(auVar39,auVar38);
  auVar54 = ZEXT416((uint)bit);
  auVar48 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpaddd_avx2(auVar53,auVar38);
  auVar20 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpaddd_avx2(auVar51,auVar38);
  auVar53 = vpsrad_avx2(auVar55,auVar54);
  auVar51 = vpmulld_avx2((undefined1  [32])in[3],auVar52);
  auVar39 = vpmulld_avx2((undefined1  [32])in[3],auVar50);
  auVar55 = vpaddd_avx2(auVar35,auVar38);
  auVar35 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpaddd_avx2(auVar51,auVar38);
  auVar54 = ZEXT416((uint)bit);
  auVar42 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpaddd_avx2(auVar39,auVar38);
  auVar50 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpmulld_avx2((undefined1  [32])in[2],auVar46);
  auVar51 = vpmulld_avx2((undefined1  [32])in[2],auVar45);
  auVar55 = vpaddd_avx2(auVar55,auVar38);
  auVar45 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpaddd_avx2(auVar51,auVar38);
  auVar46 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpmulld_avx2((undefined1  [32])in[6],auVar43);
  auVar55 = vpaddd_avx2(auVar55,auVar38);
  auVar43 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpmulld_avx2((undefined1  [32])in[6],auVar41);
  auVar55 = vpaddd_avx2(auVar55,auVar38);
  auVar41 = vpsrad_avx2(auVar55,auVar54);
  auVar55 = vpaddd_avx2(auVar48,auVar19);
  auVar19 = vpsubd_avx2(auVar19,auVar48);
  auVar51 = vpaddd_avx2(auVar42,auVar35);
  auVar52 = vpsubd_avx2(auVar42,auVar35);
  auVar39 = vpaddd_avx2(auVar50,auVar53);
  auVar21 = vpsubd_avx2(auVar50,auVar53);
  auVar53 = vpaddd_avx2(auVar20,auVar36);
  auVar20 = vpsubd_avx2(auVar36,auVar20);
  auVar35 = vpaddd_avx2(auVar43,auVar46);
  auVar22 = vpsubd_avx2(auVar46,auVar43);
  auVar36 = vpaddd_avx2(auVar41,auVar45);
  auVar23 = vpsubd_avx2(auVar45,auVar41);
  iVar26 = -iVar29;
  iVar29 = iVar29 + -1;
  auVar44._4_4_ = iVar2;
  auVar44._0_4_ = iVar2;
  auVar44._8_4_ = iVar2;
  auVar44._12_4_ = iVar2;
  auVar44._16_4_ = iVar2;
  auVar44._20_4_ = iVar2;
  auVar44._24_4_ = iVar2;
  auVar44._28_4_ = iVar2;
  auVar49._4_4_ = iVar34;
  auVar49._0_4_ = iVar34;
  auVar49._8_4_ = iVar34;
  auVar49._12_4_ = iVar34;
  auVar49._16_4_ = iVar34;
  auVar49._20_4_ = iVar34;
  auVar49._24_4_ = iVar34;
  auVar49._28_4_ = iVar34;
  auVar40._4_4_ = iVar26;
  auVar40._0_4_ = iVar26;
  auVar40._8_4_ = iVar26;
  auVar40._12_4_ = iVar26;
  auVar40._16_4_ = iVar26;
  auVar40._20_4_ = iVar26;
  auVar40._24_4_ = iVar26;
  auVar40._28_4_ = iVar26;
  auVar37._4_4_ = iVar29;
  auVar37._0_4_ = iVar29;
  auVar37._8_4_ = iVar29;
  auVar37._12_4_ = iVar29;
  auVar37._16_4_ = iVar29;
  auVar37._20_4_ = iVar29;
  auVar37._24_4_ = iVar29;
  auVar37._28_4_ = iVar29;
  auVar19 = vpmaxsd_avx2(auVar19,auVar40);
  auVar48 = vpminsd_avx2(auVar19,auVar37);
  auVar19 = vpmaxsd_avx2(auVar20,auVar40);
  auVar20 = vpminsd_avx2(auVar19,auVar37);
  auVar19 = vpmulld_avx2(auVar20,auVar44);
  auVar19 = vpaddd_avx2(auVar19,auVar38);
  auVar42 = vpmulld_avx2(auVar48,auVar49);
  auVar19 = vpaddd_avx2(auVar42,auVar19);
  auVar56._4_4_ = iVar27;
  auVar56._0_4_ = iVar27;
  auVar56._8_4_ = iVar27;
  auVar56._12_4_ = iVar27;
  auVar56._16_4_ = iVar27;
  auVar56._20_4_ = iVar27;
  auVar56._24_4_ = iVar27;
  auVar56._28_4_ = iVar27;
  auVar42 = vpmulld_avx2(auVar48,auVar44);
  auVar48 = vpmulld_avx2(auVar20,auVar56);
  auVar48 = vpaddd_avx2(auVar48,auVar38);
  auVar48 = vpaddd_avx2(auVar48,auVar42);
  auVar42._4_4_ = iVar33;
  auVar42._0_4_ = iVar33;
  auVar42._8_4_ = iVar33;
  auVar42._12_4_ = iVar33;
  auVar42._16_4_ = iVar33;
  auVar42._20_4_ = iVar33;
  auVar42._24_4_ = iVar33;
  auVar42._28_4_ = iVar33;
  auVar20 = vpmaxsd_avx2(auVar52,auVar40);
  auVar50 = vpminsd_avx2(auVar20,auVar37);
  auVar20 = vpmaxsd_avx2(auVar21,auVar40);
  auVar45 = vpminsd_avx2(auVar20,auVar37);
  auVar42 = vpmulld_avx2(auVar50,auVar42);
  auVar20 = vpmulld_avx2(auVar45,auVar49);
  auVar20 = vpaddd_avx2(auVar38,auVar20);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x1e0);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  auVar46 = vpmulld_avx2(auVar47,(undefined1  [32])*in);
  auVar20 = vpaddd_avx2(auVar42,auVar20);
  auVar42 = vpaddd_avx2(auVar46,auVar38);
  auVar43 = vpsrad_avx2(auVar42,auVar54);
  auVar50 = vpmulld_avx2(auVar50,auVar49);
  auVar42 = vpmulld_avx2((undefined1  [32])in[4],auVar56);
  auVar46 = vpmulld_avx2((undefined1  [32])in[4],auVar44);
  auVar45 = vpmulld_avx2(auVar45,auVar44);
  auVar42 = vpaddd_avx2(auVar42,auVar38);
  auVar41 = vpsrad_avx2(auVar42,auVar54);
  auVar42 = vpaddd_avx2(auVar46,auVar38);
  auVar54 = ZEXT416((uint)bit);
  auVar46 = vpsrad_avx2(auVar42,auVar54);
  auVar42 = vpaddd_avx2(auVar38,auVar45);
  auVar42 = vpaddd_avx2(auVar50,auVar42);
  auVar50 = vpaddd_avx2(auVar41,auVar43);
  auVar52 = vpsubd_avx2(auVar43,auVar41);
  auVar45 = vpaddd_avx2(auVar46,auVar43);
  auVar21 = vpsubd_avx2(auVar43,auVar46);
  auVar46 = vpmaxsd_avx2(auVar40,auVar22);
  auVar43 = vpminsd_avx2(auVar46,auVar37);
  auVar46 = vpmaxsd_avx2(auVar23,auVar40);
  auVar46 = vpminsd_avx2(auVar46,auVar37);
  auVar41 = vpmulld_avx2(auVar43,auVar47);
  auVar43 = vpmulld_avx2(auVar46,auVar47);
  auVar46 = vpsubd_avx2(auVar38,auVar41);
  auVar46 = vpaddd_avx2(auVar46,auVar43);
  auVar43 = vpaddd_avx2(auVar38,auVar43);
  auVar43 = vpaddd_avx2(auVar41,auVar43);
  auVar55 = vpmaxsd_avx2(auVar40,auVar55);
  auVar41 = vpminsd_avx2(auVar55,auVar37);
  auVar55 = vpmaxsd_avx2(auVar40,auVar51);
  auVar19 = vpsrad_avx2(auVar19,auVar54);
  auVar51 = vpminsd_avx2(auVar55,auVar37);
  auVar20 = vpsrad_avx2(auVar20,auVar54);
  auVar55 = vpaddd_avx2(auVar51,auVar41);
  auVar41 = vpsubd_avx2(auVar41,auVar51);
  auVar51 = vpaddd_avx2(auVar20,auVar19);
  auVar22 = vpsubd_avx2(auVar19,auVar20);
  auVar39 = vpmaxsd_avx2(auVar40,auVar39);
  auVar19 = vpminsd_avx2(auVar39,auVar37);
  auVar39 = vpmaxsd_avx2(auVar40,auVar53);
  auVar48 = vpsrad_avx2(auVar48,auVar54);
  auVar53 = vpminsd_avx2(auVar39,auVar37);
  auVar20 = vpsrad_avx2(auVar42,auVar54);
  auVar39 = vpaddd_avx2(auVar53,auVar19);
  auVar23 = vpsubd_avx2(auVar53,auVar19);
  auVar53 = vpaddd_avx2(auVar48,auVar20);
  auVar44 = vpsubd_avx2(auVar48,auVar20);
  auVar36 = vpmaxsd_avx2(auVar40,auVar36);
  auVar19 = vpminsd_avx2(auVar36,auVar37);
  auVar36 = vpmaxsd_avx2(auVar50,auVar40);
  auVar48 = vpminsd_avx2(auVar36,auVar37);
  auVar36 = vpaddd_avx2(auVar48,auVar19);
  auVar49 = vpsubd_avx2(auVar48,auVar19);
  auVar19 = vpmaxsd_avx2(auVar45,auVar40);
  auVar20 = vpsrad_avx2(auVar43,auVar54);
  auVar48 = vpminsd_avx2(auVar19,auVar37);
  auVar19 = vpaddd_avx2(auVar20,auVar48);
  auVar56 = vpsubd_avx2(auVar48,auVar20);
  auVar48 = vpmaxsd_avx2(auVar21,auVar40);
  auVar20 = vpminsd_avx2(auVar48,auVar37);
  auVar42 = vpsrad_avx2(auVar46,auVar54);
  auVar48 = vpaddd_avx2(auVar42,auVar20);
  auVar21 = vpsubd_avx2(auVar20,auVar42);
  auVar35 = vpmaxsd_avx2(auVar40,auVar35);
  auVar20 = vpminsd_avx2(auVar35,auVar37);
  auVar35 = vpmaxsd_avx2(auVar40,auVar52);
  auVar42 = vpminsd_avx2(auVar35,auVar37);
  auVar35 = vpaddd_avx2(auVar42,auVar20);
  auVar52 = vpsubd_avx2(auVar42,auVar20);
  auVar20 = vpmaxsd_avx2(auVar22,auVar40);
  auVar42 = vpminsd_avx2(auVar20,auVar37);
  auVar20 = vpmaxsd_avx2(auVar44,auVar40);
  auVar20 = vpminsd_avx2(auVar20,auVar37);
  auVar42 = vpmulld_avx2(auVar42,auVar47);
  auVar50 = vpmulld_avx2(auVar20,auVar47);
  auVar20 = vpsubd_avx2(auVar38,auVar42);
  auVar20 = vpaddd_avx2(auVar20,auVar50);
  auVar42 = vpaddd_avx2(auVar42,auVar38);
  auVar42 = vpaddd_avx2(auVar42,auVar50);
  auVar50 = vpmaxsd_avx2(auVar40,auVar41);
  auVar45 = vpminsd_avx2(auVar50,auVar37);
  auVar50 = vpmaxsd_avx2(auVar23,auVar40);
  auVar50 = vpminsd_avx2(auVar50,auVar37);
  auVar46 = vpmulld_avx2(auVar45,auVar47);
  auVar45 = vpmulld_avx2(auVar50,auVar47);
  auVar50 = vpsubd_avx2(auVar38,auVar46);
  auVar50 = vpaddd_avx2(auVar50,auVar45);
  auVar45 = vpaddd_avx2(auVar38,auVar45);
  auVar43 = vpsrad_avx2(auVar20,auVar54);
  auVar42 = vpsrad_avx2(auVar42,auVar54);
  auVar50 = vpsrad_avx2(auVar50,auVar54);
  auVar20 = vpaddd_avx2(auVar46,auVar45);
  auVar45 = vpsrad_avx2(auVar20,auVar54);
  auVar39 = vpmaxsd_avx2(auVar40,auVar39);
  auVar20 = vpminsd_avx2(auVar39,auVar37);
  auVar39 = vpmaxsd_avx2(auVar36,auVar40);
  auVar36 = vpminsd_avx2(auVar39,auVar37);
  auVar39 = vpaddd_avx2(auVar36,auVar20);
  auVar46 = vpsubd_avx2(auVar36,auVar20);
  auVar53 = vpmaxsd_avx2(auVar40,auVar53);
  auVar36 = vpminsd_avx2(auVar53,auVar37);
  auVar53 = vpmaxsd_avx2(auVar19,auVar40);
  auVar19 = vpminsd_avx2(auVar53,auVar37);
  auVar53 = vpaddd_avx2(auVar19,auVar36);
  auVar41 = vpsubd_avx2(auVar19,auVar36);
  auVar36 = vpmaxsd_avx2(auVar48,auVar40);
  auVar19 = vpminsd_avx2(auVar36,auVar37);
  auVar36 = vpaddd_avx2(auVar19,auVar42);
  auVar22 = vpsubd_avx2(auVar19,auVar42);
  auVar35 = vpmaxsd_avx2(auVar35,auVar40);
  auVar19 = vpminsd_avx2(auVar35,auVar37);
  auVar35 = vpaddd_avx2(auVar45,auVar19);
  auVar45 = vpsubd_avx2(auVar19,auVar45);
  auVar19 = vpmaxsd_avx2(auVar52,auVar40);
  auVar48 = vpminsd_avx2(auVar19,auVar37);
  auVar19 = vpaddd_avx2(auVar50,auVar48);
  auVar52 = vpsubd_avx2(auVar48,auVar50);
  auVar48 = vpmaxsd_avx2(auVar40,auVar21);
  auVar20 = vpminsd_avx2(auVar48,auVar37);
  auVar48 = vpaddd_avx2(auVar20,auVar43);
  auVar43 = vpsubd_avx2(auVar20,auVar43);
  auVar51 = vpmaxsd_avx2(auVar40,auVar51);
  auVar20 = vpminsd_avx2(auVar51,auVar37);
  auVar51 = vpmaxsd_avx2(auVar40,auVar56);
  auVar42 = vpminsd_avx2(auVar51,auVar37);
  auVar51 = vpaddd_avx2(auVar42,auVar20);
  auVar21 = vpsubd_avx2(auVar42,auVar20);
  auVar55 = vpmaxsd_avx2(auVar40,auVar55);
  auVar20 = vpminsd_avx2(auVar55,auVar37);
  auVar55 = vpmaxsd_avx2(auVar40,auVar49);
  auVar42 = vpminsd_avx2(auVar55,auVar37);
  auVar55 = vpaddd_avx2(auVar42,auVar20);
  auVar23 = vpsubd_avx2(auVar42,auVar20);
  auVar39 = vpmaxsd_avx2(auVar39,auVar40);
  auVar20 = vpmaxsd_avx2(auVar46,auVar40);
  auVar53 = vpmaxsd_avx2(auVar53,auVar40);
  auVar42 = vpmaxsd_avx2(auVar40,auVar41);
  auVar36 = vpmaxsd_avx2(auVar36,auVar40);
  auVar50 = vpmaxsd_avx2(auVar22,auVar40);
  auVar35 = vpmaxsd_avx2(auVar35,auVar40);
  auVar45 = vpmaxsd_avx2(auVar45,auVar40);
  auVar19 = vpmaxsd_avx2(auVar19,auVar40);
  auVar46 = vpmaxsd_avx2(auVar40,auVar52);
  auVar48 = vpmaxsd_avx2(auVar40,auVar48);
  auVar43 = vpmaxsd_avx2(auVar40,auVar43);
  auVar51 = vpmaxsd_avx2(auVar40,auVar51);
  auVar41 = vpmaxsd_avx2(auVar40,auVar21);
  auVar55 = vpmaxsd_avx2(auVar55,auVar40);
  auVar52 = vpmaxsd_avx2(auVar23,auVar40);
  alVar3 = (__m256i)vpminsd_avx2(auVar39,auVar37);
  alVar4 = (__m256i)vpminsd_avx2(auVar20,auVar37);
  alVar5 = (__m256i)vpminsd_avx2(auVar53,auVar37);
  alVar6 = (__m256i)vpminsd_avx2(auVar42,auVar37);
  alVar7 = (__m256i)vpminsd_avx2(auVar36,auVar37);
  alVar8 = (__m256i)vpminsd_avx2(auVar50,auVar37);
  alVar9 = (__m256i)vpminsd_avx2(auVar35,auVar37);
  alVar10 = (__m256i)vpminsd_avx2(auVar45,auVar37);
  alVar11 = (__m256i)vpminsd_avx2(auVar19,auVar37);
  alVar12 = (__m256i)vpminsd_avx2(auVar46,auVar37);
  alVar13 = (__m256i)vpminsd_avx2(auVar37,auVar48);
  alVar14 = (__m256i)vpminsd_avx2(auVar37,auVar43);
  alVar15 = (__m256i)vpminsd_avx2(auVar37,auVar51);
  alVar16 = (__m256i)vpminsd_avx2(auVar37,auVar41);
  alVar17 = (__m256i)vpminsd_avx2(auVar37,auVar55);
  alVar18 = (__m256i)vpminsd_avx2(auVar37,auVar52);
  *out = alVar3;
  out[0xf] = alVar4;
  out[1] = alVar5;
  out[0xe] = alVar6;
  out[2] = alVar7;
  out[0xd] = alVar8;
  out[3] = alVar9;
  out[0xc] = alVar10;
  out[4] = alVar11;
  out[0xb] = alVar12;
  out[5] = alVar13;
  out[10] = alVar14;
  out[6] = alVar15;
  out[9] = alVar16;
  out[7] = alVar17;
  out[8] = alVar18;
  if (do_cols == 0) {
    bVar28 = 10;
    if (10 < bd) {
      bVar28 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar28 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    if (out_shift != 0) {
      iVar27 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar36._4_4_ = iVar27;
      auVar36._0_4_ = iVar27;
      auVar36._8_4_ = iVar27;
      auVar36._12_4_ = iVar27;
      auVar36._16_4_ = iVar27;
      auVar36._20_4_ = iVar27;
      auVar36._24_4_ = iVar27;
      auVar36._28_4_ = iVar27;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar3,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,ZEXT416((uint)out_shift));
      *out = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar5,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,ZEXT416((uint)out_shift));
      out[1] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar7,auVar36);
      auVar54 = ZEXT416((uint)out_shift);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[2] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar9,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[3] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar11,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[4] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar13,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[5] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar15,auVar36);
      auVar54 = ZEXT416((uint)out_shift);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[6] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar17,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[7] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar18,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[8] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar16,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[9] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar14,auVar36);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[10] = alVar3;
      auVar55 = vpaddd_avx2(auVar36,(undefined1  [32])alVar12);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      out[0xb] = alVar3;
      auVar55 = vpaddd_avx2((undefined1  [32])alVar10,auVar36);
      auVar51 = vpaddd_avx2((undefined1  [32])alVar8,auVar36);
      auVar39 = vpaddd_avx2((undefined1  [32])alVar6,auVar36);
      auVar53 = vpaddd_avx2(auVar36,(undefined1  [32])alVar4);
      alVar3 = (__m256i)vpsrad_avx2(auVar55,auVar54);
      alVar4 = (__m256i)vpsrad_avx2(auVar51,auVar54);
      out[0xc] = alVar3;
      out[0xd] = alVar4;
      alVar3 = (__m256i)vpsrad_avx2(auVar39,ZEXT416((uint)out_shift));
      out[0xe] = alVar3;
      alVar3 = (__m256i)vpsrad_avx2(auVar53,ZEXT416((uint)out_shift));
      out[0xf] = alVar3;
    }
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_80,(__m256i *)&local_a0,0x10);
  }
  return;
}

Assistant:

static void idct16_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[0];
  x1[2] = input[4];
  x1[4] = input[2];
  x1[6] = input[6];
  x1[8] = input[1];
  x1[10] = input[5];
  x1[12] = input[3];
  x1[14] = input[7];

  // stage 2
  btf_16_w16_0_avx2(cospi[60], cospi[4], x1[8], x1[8], x1[15]);
  btf_16_w16_0_avx2(-cospi[36], cospi[28], x1[14], x1[9], x1[14]);
  btf_16_w16_0_avx2(cospi[44], cospi[20], x1[10], x1[10], x1[13]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x1[12], x1[11], x1[12]);

  // stage 3
  btf_16_w16_0_avx2(cospi[56], cospi[8], x1[4], x1[4], x1[7]);
  btf_16_w16_0_avx2(-cospi[40], cospi[24], x1[6], x1[5], x1[6]);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);

  // stage 4
  btf_16_w16_0_avx2(cospi[32], cospi[32], x1[0], x1[0], x1[1]);
  btf_16_w16_0_avx2(cospi[48], cospi[16], x1[2], x1[2], x1[3]);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r,
                  INV_COS_BIT);

  idct16_stage5_avx2(x1, cospi, _r, INV_COS_BIT);
  idct16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  idct16_stage7_avx2(output, x1);
}